

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_toupper(char *dst,int dst_sz,char *str)

{
  char cVar1;
  long lVar2;
  
  cVar1 = *str;
  if (dst_sz < 2 || cVar1 == '\0') {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      dst[lVar2] = (0x19 < (byte)(cVar1 + 0x9fU)) * ' ' + cVar1 + -0x20;
      cVar1 = str[lVar2 + 1];
      lVar2 = lVar2 + 1;
      if (cVar1 == '\0') break;
    } while (lVar2 < dst_sz + -1);
  }
  dst[lVar2] = '\0';
  return dst;
}

Assistant:

char* sx_toupper(char* dst, int dst_sz, const char* str)
{
    int offset = 0;
    int dst_max = dst_sz - 1;
    while (*str && offset < dst_max) {
        dst[offset++] = sx_toupperchar(*str);
        ++str;
    }
    dst[offset] = '\0';
    return dst;
}